

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O2

_Bool retro_load_game(retro_game_info *info)

{
  _Bool _Var1;
  gbstatus_e gVar2;
  char *fmt_00;
  retro_pixel_format fmt;
  retro_input_descriptor desc [9];
  
  if (core_initialized == '\0') {
    fmt_00 = "Gameboy core is not initialized! Try to reload core";
  }
  else {
    fmt = RETRO_PIXEL_FORMAT_XRGB8888;
    _Var1 = (*env_cb)(10,&fmt);
    if (_Var1) {
      check_variables();
      memcpy(desc,&DAT_0010dd30,0xd8);
      (*env_cb)(0xb,desc);
      if (info == (retro_game_info *)0x0) {
        return true;
      }
      gVar2 = gb_emu_change_rom(&gb_emu,info->path);
      if (gVar2 != GBSTATUS_OK) {
        osd_msg("%s ([%s] %s)\n","Failed to load game!",gbstatus_str_repr[gVar2],gbstatus_str);
        return false;
      }
      if (skip_bootrom != '\x01') {
        return true;
      }
      gb_emu_skip_bootrom(&gb_emu);
      return true;
    }
    fmt_00 = "XRGB8888 is not supported!";
  }
  osd_msg(fmt_00);
  return false;
}

Assistant:

bool retro_load_game(const struct retro_game_info *info)
{
   if (!core_initialized)
   {
      osd_msg("Gameboy core is not initialized! Try to reload core");
      return false;
   }

   enum retro_pixel_format fmt = RETRO_PIXEL_FORMAT_XRGB8888;
   if (!env_cb(RETRO_ENVIRONMENT_SET_PIXEL_FORMAT, &fmt))
   {
      osd_msg("XRGB8888 is not supported!");
      return false;
   }

   check_variables();

   struct retro_input_descriptor desc[] = {
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_LEFT  , "Left" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_UP    , "Up" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_DOWN  , "Down" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_RIGHT , "Right" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_A     , "A" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_B     , "B" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_SELECT, "Select" },
      { 0, RETRO_DEVICE_JOYPAD, 0, RETRO_DEVICE_ID_JOYPAD_START , "Start" },
      { 0 },
   };

   env_cb(RETRO_ENVIRONMENT_SET_INPUT_DESCRIPTORS, desc);

   // Allow running without ROM
   if (info == NULL)
      return true;

   gbstatus_e status = GBSTATUS_OK;

   status = gb_emu_change_rom(&gb_emu, info->path);
   if (status != GBSTATUS_OK)
   {
      GBSTATUS_ERR_PRINT("Failed to load game!");
      return false;
   }

   if (skip_bootrom)
      gb_emu_skip_bootrom(&gb_emu);
   
   return true;
}